

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

void __thiscall
choc::value::Type::addObjectMember(Type *this,string_view memberName,Type *memberType)

{
  Object *pOVar1;
  int iVar2;
  Type *pTVar3;
  string_view s;
  MemberNameAndType local_58;
  
  s._M_len = memberName._M_str;
  pTVar3 = memberType;
  iVar2 = getObjectMemberIndex(this,memberName);
  if (iVar2 < 0) {
    pOVar1 = (this->content).object;
    s._M_str = (char *)pTVar3;
    local_58.name =
         anon_unknown_11::allocateString
                   ((anon_unknown_11 *)this->allocator,(Allocator *)memberName._M_len,s);
    local_58.type.mainType = memberType->mainType;
    local_58.type.content.object = (memberType->content).object;
    local_58.type.content._8_8_ = *(undefined8 *)((long)&memberType->content + 8);
    local_58.type.allocator = memberType->allocator;
    memberType->mainType = void_;
    AllocatedVector<choc::value::MemberNameAndType>::push_back(&pOVar1->members,&local_58);
    deleteAllocatedObjects(&local_58.type);
    return;
  }
  throwError("This object already contains a member with the given name");
}

Assistant:

inline void Type::addObjectMember (std::string_view memberName, Type memberType)
{
    check (getObjectMemberIndex (memberName) < 0, "This object already contains a member with the given name");
    content.object->members.push_back ({ allocateString (allocator, memberName), std::move (memberType) });
}